

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

int add_user_callback(void *data,int nr_cols,char **field,char **colName)

{
  char *pcVar1;
  vector<User,_std::allocator<User>_> *this;
  int iVar2;
  ostream *poVar3;
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  User local_1e0;
  allocator local_151;
  string local_150 [8];
  string password;
  allocator local_129;
  string local_128 [32];
  string local_108 [8];
  string bio;
  allocator local_e1;
  string local_e0 [32];
  string local_c0 [8];
  string alias;
  allocator local_99;
  string local_98 [8];
  string username;
  allocator local_61;
  string local_60 [36];
  int local_3c;
  vector<User,_std::allocator<User>_> *pvStack_38;
  int id;
  vector<User,_std::allocator<User>_> *result;
  char **colName_local;
  char **field_local;
  void *pvStack_18;
  int nr_cols_local;
  void *data_local;
  
  pcVar1 = *field;
  pvStack_38 = (vector<User,_std::allocator<User>_> *)data;
  result = (vector<User,_std::allocator<User>_> *)colName;
  colName_local = field;
  field_local._4_4_ = nr_cols;
  pvStack_18 = data;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,pcVar1,&local_61);
  iVar2 = std::__cxx11::stoi((string *)local_60,(size_t *)0x0,10);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  pcVar1 = colName_local[1];
  local_3c = iVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,pcVar1,&local_99);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::string(local_c0);
  if (colName_local[2] != (char *)0x0) {
    pcVar1 = colName_local[2];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,pcVar1,&local_e1);
    std::__cxx11::string::operator=(local_c0,local_e0);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  }
  std::__cxx11::string::string(local_108);
  if (colName_local[3] != (char *)0x0) {
    pcVar1 = colName_local[3];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_128,pcVar1,&local_129);
    std::__cxx11::string::operator=(local_108,local_128);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
  }
  pcVar1 = colName_local[4];
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,pcVar1,&local_151);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  this = pvStack_38;
  iVar2 = local_3c;
  std::__cxx11::string::string(local_200,local_98);
  std::__cxx11::string::string(local_220,local_c0);
  std::__cxx11::string::string(local_240,local_108);
  std::__cxx11::string::string(local_260,local_150);
  User::User(&local_1e0,iVar2,(string *)local_200,(string *)local_220,(string *)local_240,
             (string *)local_260);
  std::vector<User,_std::allocator<User>_>::push_back(this,&local_1e0);
  User::~User(&local_1e0);
  std::__cxx11::string::~string(local_260);
  std::__cxx11::string::~string(local_240);
  std::__cxx11::string::~string(local_220);
  std::__cxx11::string::~string(local_200);
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,local_3c);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,local_98);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_150);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_98);
  return 0;
}

Assistant:

static int add_user_callback(void *data, int nr_cols, char **field, char **colName)
{
	std::vector<User>* result = static_cast<std::vector<User>*>(data);

	try
	{
		int id = std::stoi(field[0]);
		std::string username(field[1]);
		std::string alias;
		if(field[2] != nullptr)
			alias = std::string(field[2]);
		std::string bio;
		if(field[3] != nullptr)
			bio = std::string(field[3]);
		std::string password(field[4]);

		result->push_back(User(id, username, alias, bio, password));
		std::cout << id << " " << username << std::endl;
	}
	catch (...)
	{
		return 1;
	}

	return 0;
}